

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_mulr_q_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  long lVar1;
  char cVar2;
  int64_t r_bit;
  int64_t q_max;
  int64_t q_min;
  int64_t arg2_local;
  int64_t arg1_local;
  long lStack_10;
  uint32_t df_local;
  
  cVar2 = (char)df;
  lVar1 = -(1L << ((char)(1L << (cVar2 + 3U & 0x3f)) - 1U & 0x3f));
  lStack_10 = (1L << ((char)(1L << (cVar2 + 3U & 0x3f)) - 1U & 0x3f)) + -1;
  if ((arg1 != lVar1) || (arg2 != lVar1)) {
    lStack_10 = arg1 * arg2 + (1L << ((char)(1L << (cVar2 + 3U & 0x3f)) - 2U & 0x3f)) >>
                ((char)(1L << (cVar2 + 3U & 0x3f)) - 1U & 0x3f);
  }
  return lStack_10;
}

Assistant:

static inline int64_t msa_mulr_q_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int64_t q_min = DF_MIN_INT(df);
    int64_t q_max = DF_MAX_INT(df);
    int64_t r_bit = 1ULL << (DF_BITS(df) - 2);

    if (arg1 == q_min && arg2 == q_min) {
        return q_max;
    }
    return (arg1 * arg2 + r_bit) >> (DF_BITS(df) - 1);
}